

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-bignum-dtoa.cpp
# Opt level: O3

void __thiscall
icu_63::double_conversion::BignumDtoa
          (double_conversion *this,double v,BignumDtoaMode mode,int requested_digits,
          Vector<char> buffer,int *length,int *decimal_point)

{
  long lVar1;
  double dVar2;
  uint16_t uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  BignumDtoaMode BVar7;
  byte *pbVar8;
  byte bVar9;
  uint uVar10;
  undefined4 in_register_00000014;
  char *pcVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  Bignum *pBVar15;
  int *length_00;
  ulong factor;
  uint uVar16;
  bool bVar17;
  bool bVar18;
  float fVar19;
  Vector<char> buffer_00;
  Bignum denominator;
  Bignum numerator;
  Bignum delta_plus;
  Bignum delta_minus;
  Bignum local_890;
  Bignum local_678;
  Bignum local_460;
  Bignum local_248;
  
  pcVar11 = (char *)CONCAT44(in_register_00000014,requested_digits);
  length_00 = buffer._8_8_;
  uVar14 = (uint)this;
  if (uVar14 == 1) {
    fVar19 = (float)v;
    uVar10 = (uint)fVar19 & 0x7fffff;
    bVar17 = ((uint)fVar19 & 0x7f800000) == 0;
    uVar16 = uVar10 + 0x800000;
    if (bVar17) {
      uVar16 = uVar10;
    }
    factor = (ulong)uVar16;
    iVar4 = -0x95;
    if (!bVar17) {
      iVar4 = ((uint)fVar19 >> 0x17 & 0xff) - 0x96;
    }
    bVar17 = uVar10 == 0;
    bVar18 = ((uint)fVar19 & 0x7f000000) == 0;
  }
  else {
    uVar12 = (ulong)v & 0xfffffffffffff;
    bVar17 = ((ulong)v & 0x7ff0000000000000) == 0;
    factor = uVar12 + 0x10000000000000;
    if (bVar17) {
      factor = uVar12;
    }
    iVar4 = -0x432;
    if (!bVar17) {
      iVar4 = ((uint)((ulong)v >> 0x34) & 0x7ff) - 0x433;
    }
    bVar17 = uVar12 == 0;
    bVar18 = ((ulong)v & 0x7fe0000000000000) == 0;
  }
  lVar1 = 0x3f;
  if ((factor & 0xfffffffffffff) != 0) {
    for (; (factor & 0xfffffffffffff) >> lVar1 == 0; lVar1 = lVar1 + -1) {
    }
  }
  iVar13 = (iVar4 + 0xb) - ((uint)lVar1 ^ 0x3f);
  if ((factor & 0x10000000000000) != 0) {
    iVar13 = iVar4;
  }
  dVar2 = ceil((double)(iVar13 + 0x34) * 0.30102999566398114 + -1e-10);
  uVar16 = (uint)dVar2;
  if ((uVar14 == 2) && ((int)mode < (int)~uVar16)) {
    *pcVar11 = '\0';
    *length_00 = 0;
    *length = -mode;
    return;
  }
  Bignum::Bignum(&local_678);
  Bignum::Bignum(&local_890);
  Bignum::Bignum(&local_248);
  Bignum::Bignum(&local_460);
  if (iVar4 < 0) {
    if ((int)uVar16 < 0) {
      Bignum::AssignPowerUInt16(&local_678,10,-uVar16);
      if (uVar14 < 2) {
        Bignum::AssignBignum(&local_460,&local_678);
        Bignum::AssignBignum(&local_248,&local_678);
        Bignum::MultiplyByUInt64(&local_678,factor);
        iVar13 = 1;
        Bignum::AssignUInt16(&local_890,1);
        Bignum::ShiftLeft(&local_890,-iVar4);
        Bignum::ShiftLeft(&local_678,1);
      }
      else {
        Bignum::MultiplyByUInt64(&local_678,factor);
        Bignum::AssignUInt16(&local_890,1);
        iVar13 = -iVar4;
      }
      pBVar15 = &local_890;
      goto LAB_0027ad41;
    }
    Bignum::AssignUInt64(&local_678,factor);
    Bignum::AssignPowerUInt16(&local_890,10,uVar16);
    Bignum::ShiftLeft(&local_890,-iVar4);
    if (1 < uVar14) goto LAB_0027ad88;
    Bignum::ShiftLeft(&local_890,1);
    Bignum::ShiftLeft(&local_678,1);
    Bignum::AssignUInt16(&local_460,1);
    Bignum::AssignUInt16(&local_248,1);
LAB_0027ad46:
    if (!(bool)(!bVar18 & bVar17 ^ 1U | 1 < uVar14)) {
      Bignum::ShiftLeft(&local_890,1);
      Bignum::ShiftLeft(&local_678,1);
      Bignum::ShiftLeft(&local_460,1);
    }
  }
  else {
    Bignum::AssignUInt64(&local_678,factor);
    Bignum::ShiftLeft(&local_678,iVar4);
    Bignum::AssignPowerUInt16(&local_890,10,uVar16);
    if (uVar14 < 2) {
      Bignum::ShiftLeft(&local_890,1);
      Bignum::ShiftLeft(&local_678,1);
      Bignum::AssignUInt16(&local_460,1);
      Bignum::ShiftLeft(&local_460,iVar4);
      pBVar15 = &local_248;
      Bignum::AssignUInt16(pBVar15,1);
      iVar13 = iVar4;
LAB_0027ad41:
      Bignum::ShiftLeft(pBVar15,iVar13);
      goto LAB_0027ad46;
    }
  }
LAB_0027ad88:
  iVar4 = Bignum::PlusCompare(&local_678,&local_460,&local_890);
  if ((factor & 1) == 0) {
    if (iVar4 < 0) goto LAB_0027adb4;
LAB_0027ae1b:
    *length = uVar16 + 1;
  }
  else {
    if (0 < iVar4) goto LAB_0027ae1b;
LAB_0027adb4:
    *length = uVar16;
    Bignum::MultiplyByUInt32(&local_678,10);
    iVar4 = Bignum::Compare(&local_248,&local_460);
    Bignum::MultiplyByUInt32(&local_248,10);
    if (iVar4 == 0) {
      Bignum::AssignBignum(&local_460,&local_248);
    }
    else {
      Bignum::MultiplyByUInt32(&local_460,10);
    }
  }
  if (uVar14 < 2) {
    iVar4 = Bignum::Compare(&local_248,&local_460);
    pBVar15 = &local_460;
    if (iVar4 == 0) {
      pBVar15 = &local_248;
    }
    *length_00 = 0;
    uVar16 = (uint)factor & 1 ^ 1;
    uVar14 = (uint)((factor & 1) == 0);
    iVar13 = -uVar14;
    while( true ) {
      uVar3 = Bignum::DivideModuloIntBignum(&local_678,&local_890);
      iVar5 = *length_00;
      *length_00 = iVar5 + 1;
      pcVar11[iVar5] = (char)uVar3 + '0';
      iVar5 = Bignum::Compare(&local_678,&local_248);
      iVar6 = Bignum::PlusCompare(&local_678,pBVar15,&local_890);
      if ((iVar5 < (int)uVar16) ||
         (iVar6 != iVar13 && SBORROW4(iVar6,iVar13) == (int)(iVar6 + uVar14) < 0)) break;
      Bignum::MultiplyByUInt32(&local_678,10);
      Bignum::MultiplyByUInt32(&local_248,10);
      if (iVar4 != 0) {
        Bignum::MultiplyByUInt32(&local_460,10);
      }
    }
    if ((iVar5 < (int)uVar16) &&
       (iVar6 != iVar13 && SBORROW4(iVar6,iVar13) == (int)(iVar6 + uVar14) < 0)) {
      iVar4 = Bignum::PlusCompare(&local_678,&local_678,&local_890);
      if (iVar4 < 0) goto LAB_0027b005;
      pbVar8 = (byte *)(pcVar11 + (long)*length_00 + -1);
      bVar9 = *pbVar8;
      if ((iVar4 == 0) && ((bVar9 & 1) == 0)) goto LAB_0027b005;
    }
    else {
      if (iVar5 < (int)uVar16) goto LAB_0027b005;
      pbVar8 = (byte *)(pcVar11 + (long)*length_00 + -1);
      bVar9 = *pbVar8;
    }
    *pbVar8 = bVar9 + 1;
    goto LAB_0027b005;
  }
  if (uVar14 == 2) {
    BVar7 = -*length;
    if ((int)mode < (int)BVar7) {
      *length = -mode;
    }
    else {
      if (BVar7 != mode) {
        mode = *length + mode;
        goto LAB_0027ae5e;
      }
      Bignum::MultiplyByUInt32(&local_890,10);
      iVar4 = Bignum::PlusCompare(&local_678,&local_678,&local_890);
      if (-1 < iVar4) {
        *pcVar11 = '1';
        *length_00 = 1;
        *length = *length + 1;
        goto LAB_0027b005;
      }
    }
    *length_00 = 0;
  }
  else {
    if (uVar14 != 3) {
      abort();
    }
LAB_0027ae5e:
    buffer_00._8_8_ = length_00;
    buffer_00.start_ = pcVar11;
    GenerateCountedDigits(mode,length,&local_678,&local_890,buffer_00,length_00);
  }
LAB_0027b005:
  pcVar11[*length_00] = '\0';
  return;
}

Assistant:

void BignumDtoa(double v, BignumDtoaMode mode, int requested_digits,
                Vector<char> buffer, int* length, int* decimal_point) {
  ASSERT(v > 0);
  ASSERT(!Double(v).IsSpecial());
  uint64_t significand;
  int exponent;
  bool lower_boundary_is_closer;
  if (mode == BIGNUM_DTOA_SHORTEST_SINGLE) {
    float f = static_cast<float>(v);
    ASSERT(f == v);
    significand = Single(f).Significand();
    exponent = Single(f).Exponent();
    lower_boundary_is_closer = Single(f).LowerBoundaryIsCloser();
  } else {
    significand = Double(v).Significand();
    exponent = Double(v).Exponent();
    lower_boundary_is_closer = Double(v).LowerBoundaryIsCloser();
  }
  bool need_boundary_deltas =
      (mode == BIGNUM_DTOA_SHORTEST || mode == BIGNUM_DTOA_SHORTEST_SINGLE);

  bool is_even = (significand & 1) == 0;
  int normalized_exponent = NormalizedExponent(significand, exponent);
  // estimated_power might be too low by 1.
  int estimated_power = EstimatePower(normalized_exponent);

  // Shortcut for Fixed.
  // The requested digits correspond to the digits after the point. If the
  // number is much too small, then there is no need in trying to get any
  // digits.
  if (mode == BIGNUM_DTOA_FIXED && -estimated_power - 1 > requested_digits) {
    buffer[0] = '\0';
    *length = 0;
    // Set decimal-point to -requested_digits. This is what Gay does.
    // Note that it should not have any effect anyways since the string is
    // empty.
    *decimal_point = -requested_digits;
    return;
  }

  Bignum numerator;
  Bignum denominator;
  Bignum delta_minus;
  Bignum delta_plus;
  // Make sure the bignum can grow large enough. The smallest double equals
  // 4e-324. In this case the denominator needs fewer than 324*4 binary digits.
  // The maximum double is 1.7976931348623157e308 which needs fewer than
  // 308*4 binary digits.
  ASSERT(Bignum::kMaxSignificantBits >= 324*4);
  InitialScaledStartValues(significand, exponent, lower_boundary_is_closer,
                           estimated_power, need_boundary_deltas,
                           &numerator, &denominator,
                           &delta_minus, &delta_plus);
  // We now have v = (numerator / denominator) * 10^estimated_power.
  FixupMultiply10(estimated_power, is_even, decimal_point,
                  &numerator, &denominator,
                  &delta_minus, &delta_plus);
  // We now have v = (numerator / denominator) * 10^(decimal_point-1), and
  //  1 <= (numerator + delta_plus) / denominator < 10
  switch (mode) {
    case BIGNUM_DTOA_SHORTEST:
    case BIGNUM_DTOA_SHORTEST_SINGLE:
      GenerateShortestDigits(&numerator, &denominator,
                             &delta_minus, &delta_plus,
                             is_even, buffer, length);
      break;
    case BIGNUM_DTOA_FIXED:
      BignumToFixed(requested_digits, decimal_point,
                    &numerator, &denominator,
                    buffer, length);
      break;
    case BIGNUM_DTOA_PRECISION:
      GenerateCountedDigits(requested_digits, decimal_point,
                            &numerator, &denominator,
                            buffer, length);
      break;
    default:
      UNREACHABLE();
  }
  buffer[*length] = '\0';
}